

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

QString * __thiscall
QUrl::host(QString *__return_storage_ptr__,QUrl *this,ComponentFormattingOptions options)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  if (this->d != (QUrlPrivate *)0x0) {
    QUrlPrivate::appendHost
              (this->d,__return_storage_ptr__,
               (FormattingOptions)
               options.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
               super_QFlagsStorage<QUrl::ComponentFormattingOption>.i);
    bVar4 = QString::startsWith(__return_storage_ptr__,(QChar)0x5b,CaseSensitive);
    if (bVar4) {
      QString::mid((QString *)&local_38,__return_storage_ptr__,1,
                   (__return_storage_ptr__->d).size + -2);
      pDVar2 = (__return_storage_ptr__->d).d;
      pcVar3 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_38.d;
      (__return_storage_ptr__->d).ptr = local_38.ptr;
      qVar1 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_38.size;
      local_38.d = pDVar2;
      local_38.ptr = pcVar3;
      local_38.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrl::host(ComponentFormattingOptions options) const
{
    QString result;
    if (d) {
        d->appendHost(result, options);
        if (result.startsWith(u'['))
            result = result.mid(1, result.size() - 2);
    }
    return result;
}